

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O3

size_t adios2sysEncoding_mbstowcs(wchar_t *dest,char *str,size_t n)

{
  size_t sVar1;
  
  if (str == (char *)0x0) {
    return 0xffffffffffffffff;
  }
  sVar1 = mbstowcs(dest,str,n);
  return sVar1;
}

Assistant:

size_t kwsysEncoding_mbstowcs(wchar_t* dest, const char* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n) -
    1;
#else
  return mbstowcs(dest, str, n);
#endif
}